

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPScheduleClause::toString_abi_cxx11_(string *__return_storage_ptr__,OpenMPScheduleClause *this)

{
  bool bVar1;
  ulong uVar2;
  string local_a0;
  string local_80;
  OpenMPScheduleClauseKind local_60;
  OpenMPScheduleClauseModifier local_5c;
  OpenMPScheduleClauseKind kind;
  OpenMPScheduleClauseModifier modifier2;
  OpenMPScheduleClauseModifier modifier1;
  string clause_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPScheduleClause *local_18;
  OpenMPScheduleClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPScheduleClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"schedule ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&modifier1,"(",(allocator<char> *)((long)&modifier2 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&modifier2 + 3));
  kind = getModifier1(this);
  local_5c = getModifier2(this);
  local_60 = getKind(this);
  if (kind == OMPC_SCHEDULE_KIND_static) {
    std::__cxx11::string::operator+=((string *)&modifier1,"monotonic");
  }
  else if (kind == OMPC_SCHEDULE_KIND_dynamic) {
    std::__cxx11::string::operator+=((string *)&modifier1,"nonmonotonic");
  }
  else if (kind == OMPC_SCHEDULE_KIND_guided) {
    std::__cxx11::string::operator+=((string *)&modifier1,"simd");
  }
  if (local_5c == OMPC_SCHEDULE_MODIFIER_monotonic) {
    std::__cxx11::string::operator+=((string *)&modifier1,",monotonic");
  }
  else if (local_5c == OMPC_SCHEDULE_MODIFIER_nonmonotonic) {
    std::__cxx11::string::operator+=((string *)&modifier1,",nonmonotonic");
  }
  else if (local_5c == OMPC_SCHEDULE_MODIFIER_simd) {
    std::__cxx11::string::operator+=((string *)&modifier1,",simd");
  }
  uVar2 = std::__cxx11::string::size();
  if (1 < uVar2) {
    std::__cxx11::string::operator+=((string *)&modifier1,":");
  }
  switch(local_60) {
  case OMPC_SCHEDULE_KIND_static:
    std::__cxx11::string::operator+=((string *)&modifier1,"static");
    break;
  case OMPC_SCHEDULE_KIND_dynamic:
    std::__cxx11::string::operator+=((string *)&modifier1,"dynamic");
    break;
  case OMPC_SCHEDULE_KIND_guided:
    std::__cxx11::string::operator+=((string *)&modifier1,"guided");
    break;
  case OMPC_SCHEDULE_KIND_auto:
    std::__cxx11::string::operator+=((string *)&modifier1,"auto");
    break;
  case OMPC_SCHEDULE_KIND_runtime:
    std::__cxx11::string::operator+=((string *)&modifier1,"runtime");
  }
  getChunkSize_abi_cxx11_(&local_80,this);
  bVar1 = std::operator!=(&local_80,"");
  std::__cxx11::string::~string((string *)&local_80);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&modifier1,", ");
    getChunkSize_abi_cxx11_(&local_a0,this);
    std::__cxx11::string::operator+=((string *)&modifier1,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  std::__cxx11::string::operator+=((string *)&modifier1,") ");
  uVar2 = std::__cxx11::string::size();
  if (3 < uVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&modifier1);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)&modifier1);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPScheduleClause::toString() {

    std::string result = "schedule ";
    std::string clause_string = "(";
    OpenMPScheduleClauseModifier modifier1 = this->getModifier1();
    OpenMPScheduleClauseModifier modifier2 = this->getModifier2();
    OpenMPScheduleClauseKind kind = this->getKind();
    switch (modifier1) {
        case OMPC_SCHEDULE_MODIFIER_monotonic:
            clause_string += "monotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_nonmonotonic:
            clause_string += "nonmonotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_simd:
            clause_string += "simd";
            break;
        default:
            ;
    }
    switch (modifier2) {
        case OMPC_SCHEDULE_MODIFIER_monotonic:
            clause_string += ",monotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_nonmonotonic:
            clause_string += ",nonmonotonic";
            break;
        case OMPC_SCHEDULE_MODIFIER_simd:
            clause_string += ",simd";
            break;
        default:
            ;
    }
    if (clause_string.size() > 1){
        clause_string += ":"; 
    }
    switch (kind) {
        case OMPC_SCHEDULE_KIND_static:
            clause_string += "static";
            break;
        case OMPC_SCHEDULE_KIND_dynamic:
            clause_string += "dynamic";
            break;
        case OMPC_SCHEDULE_KIND_guided:
            clause_string += "guided";
            break;
        case OMPC_SCHEDULE_KIND_auto:
            clause_string += "auto";
            break;
        case OMPC_SCHEDULE_KIND_runtime:
            clause_string += "runtime";
            break;
        default:
            ;
    }
    if (this->getChunkSize() != ""){
        clause_string += ", ";
        clause_string += this->getChunkSize();
    }
    clause_string += ") ";
    if (clause_string.size() > 3) {
        result += clause_string;
    };

    return result;
}